

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> *
__thiscall Catch::clara::detail::Parser::getHelpColumns(Parser *this)

{
  bool bVar1;
  iterator this_00;
  long in_RSI;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *in_RDI;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  childCols;
  Opt *o;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *__range3;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *cols;
  Opt *in_stack_000001c8;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *in_stack_ffffffffffffff48;
  __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
  *in_stack_ffffffffffffff50;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *this_01;
  __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
  in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
  local_50 [3];
  reference local_38;
  Opt *local_30;
  __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
  local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_01 = in_RDI;
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::vector((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
            *)0x2a5c3e);
  local_20 = in_RSI + 0x30;
  local_28._M_current =
       (Opt *)std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
              begin((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *
                    )in_stack_ffffffffffffff48);
  local_30 = (Opt *)std::
                    vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
                    end((vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                         *)in_stack_ffffffffffffff48);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff50,
                            (__normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
                             *)in_stack_ffffffffffffff48), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
               ::operator*(&local_28);
    Opt::getHelpColumns(in_stack_000001c8);
    this_00 = std::
              vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
              ::end(in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::HelpColumns_const*,std::vector<Catch::clara::detail::HelpColumns,std::allocator<Catch::clara::detail::HelpColumns>>>
    ::__normal_iterator<Catch::clara::detail::HelpColumns*>
              ((__normal_iterator<const_Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                *)in_stack_ffffffffffffff50,
               (__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff50 = local_50;
    std::
    vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>::
    begin(in_stack_ffffffffffffff48);
    std::
    vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>::
    end(in_stack_ffffffffffffff48);
    ::std::
    vector<Catch::clara::detail::HelpColumns,std::allocator<Catch::clara::detail::HelpColumns>>::
    insert<__gnu_cxx::__normal_iterator<Catch::clara::detail::HelpColumns*,std::vector<Catch::clara::detail::HelpColumns,std::allocator<Catch::clara::detail::HelpColumns>>>,void>
              ((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                *)this_00._M_current,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    std::
    vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>::
    ~vector(this_01);
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
    ::operator++(&local_28);
  }
  return in_RDI;
}

Assistant:

auto getHelpColumns() const -> std::vector<HelpColumns> {
            std::vector<HelpColumns> cols;
            for (auto const &o : m_options) {
                auto childCols = o.getHelpColumns();
                cols.insert( cols.end(), childCols.begin(), childCols.end() );
            }
            return cols;
        }